

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_util_tracek(lua_State *L)

{
  TValue *pTVar1;
  uint uVar2;
  int iVar3;
  GCtrace *pGVar4;
  IRIns *ir;
  
  pGVar4 = jit_checktrace(L);
  uVar2 = lj_lib_checkint(L,2);
  iVar3 = 0;
  if (((pGVar4 != (GCtrace *)0x0) && (0xffff7fff < uVar2)) &&
     (iVar3 = 0, pGVar4->nk <= uVar2 + 0x8000)) {
    ir = pGVar4->ir + (uVar2 + 0x8000);
    if ((ir->field_1).o == '\x1d') {
      uVar2 = (uint)(ir->field_0).op2;
      ir = pGVar4->ir + (ir->field_0).op1;
    }
    else {
      uVar2 = 0xffffffff;
    }
    lj_ir_kvalue(L,L->top + -2,ir);
    L->top[-1].n = (double)((ir->field_1).t.irt & 0x1f);
    iVar3 = 2;
    if (uVar2 != 0xffffffff) {
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pTVar1->n = (double)(int)uVar2;
      iVar3 = 3;
    }
  }
  return iVar3;
}

Assistant:

LJLIB_CF(jit_util_tracek)
{
  GCtrace *T = jit_checktrace(L);
  IRRef ref = (IRRef)lj_lib_checkint(L, 2) + REF_BIAS;
  if (T && ref >= T->nk && ref < REF_BIAS) {
    IRIns *ir = &T->ir[ref];
    int32_t slot = -1;
    if (ir->o == IR_KSLOT) {
      slot = ir->op2;
      ir = &T->ir[ir->op1];
    }
    lj_ir_kvalue(L, L->top-2, ir);
    setintV(L->top-1, (int32_t)irt_type(ir->t));
    if (slot == -1)
      return 2;
    setintV(L->top++, slot);
    return 3;
  }
  return 0;
}